

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  pointer pbVar1;
  long *plVar2;
  bool bVar3;
  ostream *poVar4;
  long lVar5;
  int iVar6;
  char *pcVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *a;
  pointer pbVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  attr;
  string input;
  lexer lex;
  iterator theEnd;
  iterator iter;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_178;
  long *local_158;
  long local_150;
  long local_148 [2];
  lexer local_138;
  iterator local_128;
  undefined1 local_e8 [32];
  _Alloc_hider local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  iterator local_a8;
  char *local_68;
  TokenType local_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined4 uStack_54;
  char *local_50;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  if (argc < 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Need something to parse\n",0x18);
    return 1;
  }
  std::__cxx11::string::string((string *)&local_158,argv[1],(allocator *)local_e8);
  plVar2 = local_158;
  pcVar7 = (char *)((long)local_158 + local_150);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Parsing : ",10);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_158,local_150);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  local_e8._0_8_ = plVar2;
  local_a8.m_end._M_current = pcVar7;
  lexer::lexer(&local_138,(iit *)local_e8,&local_a8.m_end);
  lexer::iterator::iterator(&local_a8,&local_138.m_start,&local_138.m_end);
  lexer::iterator::iterator(&local_128,&local_138.m_end);
  local_178.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68 = local_128.m_end._M_current;
  local_60 = local_128.m_curr_tok.toktype;
  uStack_5c = local_128.m_curr_tok._4_4_;
  uStack_58 = local_128.m_curr_tok.start_iter._M_current._0_4_;
  uStack_54 = local_128.m_curr_tok.start_iter._M_current._4_4_;
  local_50 = local_128.m_curr_tok.end_iter._M_current;
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,local_128.m_curr_tok.lexeme._M_dataplus._M_p,
             local_128.m_curr_tok.lexeme._M_dataplus._M_p +
             local_128.m_curr_tok.lexeme._M_string_length);
  local_e8._0_8_ = local_68;
  local_e8._8_4_ = local_60;
  local_e8._12_4_ = uStack_5c;
  local_e8._16_4_ = uStack_58;
  local_e8._20_4_ = uStack_54;
  local_e8._24_8_ = local_50;
  local_c8._M_p = (pointer)&local_b8;
  std::__cxx11::string::_M_construct<char*>((string *)&local_c8,local_48,local_40 + (long)local_48);
  bVar3 = boost::spirit::x3::
          plus<boost::spirit::x3::alternative<boost::spirit::x3::sequence<boost::spirit::x3::sequence<tok_kw,tok_sym>,tok_kw>,boost::spirit::x3::sequence<boost::spirit::x3::sequence<boost::spirit::x3::sequence<boost::spirit::x3::sequence<tok_kw,tok_sym>,tok_kw>,tok_kw>,tok_kw>>>
          ::
          parse<lexer::iterator,boost::spirit::x3::unused_type,boost::spirit::x3::unused_type_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ((plus<boost::spirit::x3::alternative<boost::spirit::x3::sequence<boost::spirit::x3::sequence<tok_kw,tok_sym>,tok_kw>,boost::spirit::x3::sequence<boost::spirit::x3::sequence<boost::spirit::x3::sequence<boost::spirit::x3::sequence<tok_kw,tok_sym>,tok_kw>,tok_kw>,tok_kw>>>
                      *)&program,&local_a8,(iterator *)local_e8,
                     (unused_type *)&boost::spirit::x3::unused,
                     (unused_type *)&boost::spirit::x3::unused,&local_178);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_p != &local_b8) {
    operator_delete(local_c8._M_p,local_b8._M_allocated_capacity + 1);
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  if (bVar3) {
    bVar3 = lexer::iterator::operator!=(&local_a8,&local_128);
    if (!bVar3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"SUCCESS: Good Input\n",0x14);
      pbVar1 = local_178.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      iVar6 = 0;
      for (pbVar8 = local_178.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar8 != pbVar1; pbVar8 = pbVar8 + 1
          ) {
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(pbVar8->_M_dataplus)._M_p,
                            pbVar8->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      }
      goto LAB_001015c1;
    }
    lVar5 = 0x24;
    pcVar7 = "FAILED: didn\'t parse all the output\n";
  }
  else {
    lVar5 = 0x19;
    pcVar7 = "FAILED: returned failure\n";
  }
  iVar6 = 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar7,lVar5);
LAB_001015c1:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_178);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128.m_curr_tok.lexeme._M_dataplus._M_p != &local_128.m_curr_tok.lexeme.field_2) {
    operator_delete(local_128.m_curr_tok.lexeme._M_dataplus._M_p,
                    local_128.m_curr_tok.lexeme.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.m_curr_tok.lexeme._M_dataplus._M_p != &local_a8.m_curr_tok.lexeme.field_2) {
    operator_delete(local_a8.m_curr_tok.lexeme._M_dataplus._M_p,
                    local_a8.m_curr_tok.lexeme.field_2._M_allocated_capacity + 1);
  }
  if (local_158 != local_148) {
    operator_delete(local_158,local_148[0] + 1);
  }
  return iVar6;
}

Assistant:

int main(int argc, char **argv)
{
    if (argc < 2) {
        std::cout << "Need something to parse\n";
        return 1;
    }

    std::string input(argv[1]);
    auto ibeg = input.begin();
    auto iend = input.end();
    
    std::cout << "Parsing : " << input << "\n";
    lexer lex(ibeg, iend);
    
    auto iter = lex.begin();
    auto theEnd = lex.end();

    std::vector<std::string> attr;
    
    
    bool r = x3::parse(iter, theEnd, program, attr);
    if (r) {
        if (iter != theEnd) {
            std::cout << "FAILED: didn't parse all the output\n";
            return 1;
        } else {
            std::cout << "SUCCESS: Good Input\n";
            for (auto const&a : attr) {
                std::cout << a << "\n";
            }
            return 0;
        }
    } else {
        std::cout << "FAILED: returned failure\n";
        return 1;
    }

}